

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

void unsupp_relocs(LinkedSection *sec)

{
  node *pnVar1;
  long in_RDI;
  Reloc *rel;
  
  while( true ) {
    pnVar1 = remhead((list *)(in_RDI + 0x88));
    if (pnVar1 == (node *)0x0) break;
    error(0x20,fff_amigahunk.tname,reloc_name[*(byte *)&pnVar1[3].pred],
          (ulong)*(ushort *)&(pnVar1[3].next)->pred,
          (ulong)*(ushort *)((long)&(pnVar1[3].next)->pred + 2),pnVar1[3].next[1].next,
          *(undefined8 *)(in_RDI + 0x18),pnVar1[2].next);
  }
  return;
}

Assistant:

static void unsupp_relocs(struct LinkedSection *sec)
{
  struct Reloc *rel;

  while (rel = (struct Reloc *)remhead(&sec->relocs)) {
    error(32,fff_amigahunk.tname,reloc_name[rel->rtype],
          (int)rel->insert->bpos,(int)rel->insert->bsiz,
          rel->insert->mask,sec->name,rel->offset);
  }
}